

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall RefTable::Mark(RefTable *this,SQCollectable_conflict **chain)

{
  SQUnsignedInteger n;
  ulong uVar1;
  RefNode *o;
  
  o = this->_nodes;
  for (uVar1 = 0; uVar1 < this->_numofslots; uVar1 = uVar1 + 1) {
    if ((o->obj).super_SQObject._type != OT_NULL) {
      SQSharedState::MarkObject(&o->obj,chain);
    }
    o = o + 1;
  }
  return;
}

Assistant:

void RefTable::Mark(SQCollectable **chain)
{
    RefNode *nodes = (RefNode *)_nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        if(sq_type(nodes->obj) != OT_NULL) {
            SQSharedState::MarkObject(nodes->obj,chain);
        }
        nodes++;
    }
}